

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

size_t units::findWordOperatorSep(string *ustring,string *keyword)

{
  char closeSegment;
  undefined8 in_RAX;
  size_type sVar1;
  byte *pbVar2;
  size_type sVar3;
  size_type sVar4;
  ulong __pos;
  undefined4 uStack_38;
  int index;
  
  _uStack_38 = in_RAX;
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (ustring,keyword,0xffffffffffffffff);
  __pos = ustring->_M_string_length;
  sVar4 = sVar1;
  if (keyword->_M_string_length + sVar1 + 1 < __pos) {
    pbVar2 = (byte *)((ustring->_M_dataplus)._M_p + keyword->_M_string_length + sVar1);
    while ((((sVar4 = sVar1, *pbVar2 - 0x2a < 0x35 &&
             ((0x10000000000021U >> ((ulong)(*pbVar2 - 0x2a) & 0x3f) & 1) != 0)) &&
            (sVar4 = 0xffffffffffffffff, sVar1 != 0)) &&
           (sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::rfind(ustring,keyword,sVar1 - 1), sVar1 != 0xffffffffffffffff))) {
      pbVar2 = (byte *)((ustring->_M_dataplus)._M_p + keyword->_M_string_length + sVar1);
    }
    __pos = ustring->_M_string_length;
  }
  while( true ) {
    if (sVar4 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ustring,")}]",__pos);
    if (sVar3 == 0xffffffffffffffff) {
      return sVar4;
    }
    if (sVar3 < sVar4) {
      return sVar4;
    }
    closeSegment = getMatchCharacter((ustring->_M_dataplus)._M_p[sVar3]);
    _uStack_38 = CONCAT44((int)sVar3 + -2,uStack_38);
    segmentcheckReverse(ustring,closeSegment,&index);
    __pos = (ulong)index;
    if ((long)__pos < 0) break;
    if (__pos < sVar4) {
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                        (ustring,keyword,__pos);
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t
    findWordOperatorSep(const std::string& ustring, const std::string& keyword)
{
    auto sep = ustring.rfind(keyword);
    if (ustring.size() > sep + keyword.size() + 1) {
        auto keychar = ustring[sep + keyword.size()];
        while (keychar == '^' || keychar == '*' || keychar == '/') {
            if (sep == 0) {
                sep = std::string::npos;
                break;
            }
            sep = ustring.rfind(keyword, sep - 1);
            if (sep == std::string::npos) {
                break;
            }
            keychar = ustring[sep + keyword.size()];
        }
    }
    size_t findex = ustring.size();
    while (sep != std::string::npos) {
        auto lbrack = ustring.find_last_of(")}]", findex);

        if (lbrack == std::string::npos) {
            return sep;
        }
        if (lbrack < sep) {
            // this should not happen as it would mean the operator separator
            // didn't function properly
            return sep;  // LCOV_EXCL_LINE
        }
        auto cchar = getMatchCharacter(ustring[lbrack]);
        --lbrack;
        int index = static_cast<int>(lbrack) - 1;
        segmentcheckReverse(ustring, cchar, index);
        if (index < 0) {
            // this should not happen as it would mean we got this point by
            // bypassing some other checks
            return std::string::npos;  // LCOV_EXCL_LINE
        }
        findex = static_cast<size_t>(index);
        if (findex < sep) {
            sep = ustring.rfind(keyword, findex);
        }
    }
    return sep;
}